

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixTone.cpp
# Opt level: O0

void MakeWaveTables(void)

{
  int iVar1;
  double dVar2;
  int local_10;
  int local_c;
  int a;
  int i;
  
  for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
    dVar2 = sin((double)local_c * 6.283184 * 0.00390625);
    gWaveModelTable[0][local_c] = (char)(int)(dVar2 * 64.0);
  }
  local_10 = 0;
  for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
    gWaveModelTable[1][local_c] = (char)((long)(local_10 << 6) / 0x40);
    local_10 = local_10 + 1;
  }
  local_10 = 0;
  for (; local_c < 0xc0; local_c = local_c + 1) {
    gWaveModelTable[1][local_c] = '@' - (char)((local_10 << 6) / 0x40);
    local_10 = local_10 + 1;
  }
  local_10 = 0;
  for (; local_c < 0x100; local_c = local_c + 1) {
    gWaveModelTable[1][local_c] = (char)((local_10 << 6) / 0x40) + -0x40;
    local_10 = local_10 + 1;
  }
  for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
    gWaveModelTable[2][local_c] = (char)(local_c / 2) + -0x40;
  }
  for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
    gWaveModelTable[3][local_c] = '@' - (char)(local_c / 2);
  }
  for (local_c = 0; local_c < 0x80; local_c = local_c + 1) {
    gWaveModelTable[4][local_c] = '@';
  }
  for (; local_c < 0x100; local_c = local_c + 1) {
    gWaveModelTable[4][local_c] = -0x40;
  }
  msvc_srand(0);
  for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
    iVar1 = msvc_rand();
    gWaveModelTable[5][local_c] = (char)((long)(int)(char)iVar1 / 2);
  }
  return;
}

Assistant:

void MakeWaveTables(void)
{
	int i;

	int a;

	// Sine wave
	for (i = 0; i < 0x100; ++i)
	{
		gWaveModelTable[0][i] = (signed char)(sin((i * 6.283184) / 256.0) * 64.0);
		a = gWaveModelTable[0][i];	// I have no idea what this line was meant to do
	}

	// Triangle wave
	for (a = 0, i = 0; i < 0x40; ++i)
	{
		// Upwards
		gWaveModelTable[1][i] = (a * 0x40) / 0x40;
		++a;
	}
	for (a = 0; i < 0xC0; ++i)
	{
		// Downwards
		gWaveModelTable[1][i] = 0x40 - ((a * 0x40) / 0x40);
		++a;
	}
	for (a = 0; i < 0x100; ++i)
	{
		// Back up
		gWaveModelTable[1][i] = ((a * 0x40) / 0x40) - 0x40;
		++a;
	}

	// Saw up wave
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[2][i] = (i / 2) - 0x40;

	// Saw down wave
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[3][i] = 0x40 - (i / 2);

	// Square wave
	for (i = 0; i < 0x80; ++i)
		gWaveModelTable[4][i] = 0x40;
	for (; i < 0x100; ++i)
		gWaveModelTable[4][i] = -0x40;

	// White noise wave
	msvc_srand(0);
	for (i = 0; i < 0x100; ++i)
		gWaveModelTable[5][i] = (signed char)(msvc_rand() & 0xFF) / 2;
}